

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::mousePressEvent(QToolButton *this,QMouseEvent *e)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  char cVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  QPointF local_e8;
  QPoint local_d8;
  undefined1 local_d0 [16];
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&opt);
  auVar3._8_8_ = local_d0._8_8_;
  auVar3._0_8_ = local_d0._0_8_;
  if ((*(int *)(e + 0x40) == 1) && (local_d0 = auVar3, *(int *)(lVar2 + 0x2e8) == 1)) {
    pQVar5 = QWidget::style((QWidget *)this);
    local_d0 = (**(code **)(*(long *)pQVar5 + 0xd8))(pQVar5,4,&opt,2,this);
    if ((local_d0._0_4_ <= local_d0._8_4_) && (local_d0._4_4_ <= local_d0._12_4_)) {
      local_e8 = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_d8 = QPointF::toPoint(&local_e8);
      cVar4 = QRect::contains((QPoint *)local_d0,SUB81(&local_d8,0));
      if (cVar4 != '\0') {
        *(byte *)(lVar2 + 0x2ec) = (*(byte *)(lVar2 + 0x2ec) & 0xfc) + 1;
        showMenu(this);
        goto LAB_0047888a;
      }
    }
  }
  *(byte *)(lVar2 + 0x2ec) = *(byte *)(lVar2 + 0x2ec) & 0xfc | 2;
  QAbstractButton::mousePressEvent(&this->super_QAbstractButton,e);
LAB_0047888a:
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::mousePressEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    if (e->button() == Qt::LeftButton && (d->popupMode == MenuButtonPopup)) {
        QRect popupr = style()->subControlRect(QStyle::CC_ToolButton, &opt,
                                               QStyle::SC_ToolButtonMenu, this);
        if (popupr.isValid() && popupr.contains(e->position().toPoint())) {
            d->buttonPressed = QToolButtonPrivate::MenuButtonPressed;
            showMenu();
            return;
        }
    }
#endif
    d->buttonPressed = QToolButtonPrivate::ToolButtonPressed;
    QAbstractButton::mousePressEvent(e);
}